

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 UVar1;
  U32 UVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  UVar1 = size + 0xf;
  if (-1 < (int)size) {
    UVar1 = size;
  }
  if ((size & 0xf) == 0) {
    if (-1 < (int)size) {
      if (0xf < (int)size) {
        iVar3 = 0;
        iVar4 = 0;
        do {
          lVar5 = 0;
          do {
            UVar2 = table[iVar3 + lVar5] - reducerValue;
            if (table[iVar3 + lVar5] < reducerValue + 2) {
              UVar2 = 0;
            }
            table[iVar3 + lVar5] = UVar2;
            lVar5 = lVar5 + 1;
          } while ((int)lVar5 != 0x10);
          iVar3 = iVar3 + 0x10;
          iVar4 = iVar4 + 1;
        } while (iVar4 != (int)UVar1 >> 4);
      }
      return;
    }
    __assert_fail("size < (1U<<31)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0xa04,
                  "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)");
  }
  __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0xa03,"void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
               );
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}